

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  code *local_190;
  undefined8 local_188;
  type local_180;
  string_view local_168;
  code *local_158;
  undefined8 local_150;
  type local_148;
  string_view local_130;
  code *local_120;
  undefined8 local_118;
  type local_110;
  string_view local_f8 [2];
  byte local_d1;
  undefined1 local_d0 [7];
  bool show;
  Graph g;
  uint64_t recursive;
  uint64_t m;
  uint64_t n;
  
  n._4_4_ = 0;
  std::operator<<((ostream *)&std::cout,"Enter n and m: ");
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&m);
  std::istream::operator>>(this,&recursive);
  std::operator<<((ostream *)&std::cout,"Wanna sum recursion? ");
  std::istream::operator>>
            ((istream *)&std::cin,
             (ulong *)&g.bridges.
                       super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  Graph::Graph((Graph *)local_d0,m,recursive);
  local_d1 = m * recursive < 0x3e9;
  if ((bool)local_d1) {
    operator<<((ostream *)&std::cout,(Graph *)local_d0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_f8,"Random");
  local_120 = Graph::random_bridges_search;
  local_118 = 0;
  std::
  bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*)(bool),std::_Placeholder<1>const&,unsigned_long&>
            (&local_110,(offset_in_Graph_to_subr *)&local_120,
             (_Placeholder<1> *)&std::placeholders::_1,
             (unsigned_long *)
             &g.bridges.super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            ((Graph *)local_d0,local_f8[0],&local_110,(bool)(local_d1 & 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,"Random two-bridges");
  local_158 = Graph::random_two_bridges_search;
  local_150 = 0;
  std::
  bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*)(bool),std::_Placeholder<1>const&,unsigned_long&>
            (&local_148,(offset_in_Graph_to_subr *)&local_158,
             (_Placeholder<1> *)&std::placeholders::_1,
             (unsigned_long *)
             &g.bridges.super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  estimate<std::_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            ((Graph *)local_d0,local_130,&local_148,(bool)(local_d1 & 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,"Determenistic");
  local_190 = Graph::determined_bridges_search;
  local_188 = 0;
  std::
  bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*)(bool),std::_Placeholder<1>const&,unsigned_long&>
            (&local_180,(offset_in_Graph_to_subr *)&local_190,
             (_Placeholder<1> *)&std::placeholders::_1,
             (unsigned_long *)
             &g.bridges.super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            ((Graph *)local_d0,local_168,&local_180,(bool)(local_d1 & 1));
  Graph::~Graph((Graph *)local_d0);
  return n._4_4_;
}

Assistant:

int main() {
    std::uint64_t n, m, recursive;

    std::cout << "Enter n and m: ";
    std::cin >> n >> m;
    std::cout << "Wanna sum recursion? ";
    std::cin >> recursive;

    Graph g(n, m);

    bool show = (n * m <= 1000);
    if (show)
        std::cout << g;

    estimate(g, "Random",
             std::bind(&Graph::random_bridges_search, _1, recursive), show);
    estimate(g, "Random two-bridges",
             std::bind(&Graph::random_two_bridges_search, _1, recursive), show);
    estimate(g, "Determenistic",
             std::bind(&Graph::determined_bridges_search, _1, recursive), show);
}